

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QStaticTextItem>::emplace<QStaticTextItem_const&>
          (QMovableArrayOps<QStaticTextItem> *this,qsizetype i,QStaticTextItem *args)

{
  QStaticTextItem **ppQVar1;
  qsizetype *pqVar2;
  long *plVar3;
  int *piVar4;
  QFont *this_00;
  Data *pDVar5;
  QStaticTextItem *pQVar6;
  QFontEngine *pQVar7;
  QStaticTextItem *pQVar8;
  QStaticTextUserData *pQVar9;
  undefined8 uVar10;
  anon_union_8_2_efa21287_for_QStaticTextItem_2 aVar11;
  QStaticTextItem *__dest;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter local_b0;
  anon_union_8_2_440ea5df_for_QStaticTextItem_0 local_88;
  anon_union_8_2_efa21287_for_QStaticTextItem_2 aStack_80;
  int local_78;
  undefined1 local_74 [8];
  undefined1 *puStack_6c;
  undefined4 local_64;
  Spec SStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  QStaticTextUserData *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QStaticTextItem>).super_QArrayDataPointer<QStaticTextItem>.
           d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b6c2c:
    this_00 = (QFont *)(local_74 + 4);
    uStack_44 = 0xaaaaaaaa;
    pQStack_40 = (QStaticTextUserData *)&DAT_aaaaaaaaaaaaaaaa;
    local_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    uStack_48 = 0xaaaaaaaa;
    local_64 = 0xaaaaaaaa;
    SStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    uStack_58 = 0xaaaaaaaa;
    local_74 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    puStack_6c = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = args->field_0;
    aStack_80 = args->field_1;
    local_78 = args->numGlyphs;
    QFont::QFont(this_00,&args->font);
    uStack_50 = CONCAT31(uStack_50._1_3_,args->field_0x38);
    uVar10 = *(undefined8 *)((long)&(args->color).ct + 4);
    SStack_60 = (Spec)*(undefined8 *)&args->color;
    uStack_5c = (undefined4)((ulong)*(undefined8 *)&args->color >> 0x20);
    uStack_58 = (undefined4)uVar10;
    local_54 = (undefined4)((ulong)uVar10 >> 0x20);
    pQVar7 = (args->m_fontEngine).d.ptr;
    uStack_48 = SUB84(pQVar7,0);
    uStack_44 = (undefined4)((ulong)pQVar7 >> 0x20);
    if (pQVar7 != (QFontEngine *)0x0) {
      LOCK();
      (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQStack_40 = (args->m_userData).d.ptr;
    if (pQStack_40 != (QStaticTextUserData *)0x0) {
      LOCK();
      (pQStack_40->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQStack_40->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar12 = (this->super_QGenericArrayOps<QStaticTextItem>).
             super_QArrayDataPointer<QStaticTextItem>.size != 0;
    QArrayDataPointer<QStaticTextItem>::detachAndGrow
              ((QArrayDataPointer<QStaticTextItem> *)this,(uint)(i == 0 && bVar12),1,
               (QStaticTextItem **)0x0,(QArrayDataPointer<QStaticTextItem> *)0x0);
    if (i == 0 && bVar12) {
      pQVar6 = (this->super_QGenericArrayOps<QStaticTextItem>).
               super_QArrayDataPointer<QStaticTextItem>.ptr;
      pQVar6[-1].numGlyphs = local_78;
      pQVar6[-1].field_0 = local_88;
      pQVar6[-1].field_1 = aStack_80;
      QFont::QFont(&pQVar6[-1].font,this_00);
      pQVar9 = pQStack_40;
      pQVar6[-1].field_0x38 = (undefined1)uStack_50;
      pQVar6[-1].color.cspec = SStack_60;
      *(undefined4 *)&pQVar6[-1].color.ct = uStack_5c;
      *(undefined4 *)((long)&pQVar6[-1].color.ct + 4) = uStack_58;
      *(undefined4 *)((long)&pQVar6[-1].color.ct + 8) = local_54;
      pQVar7 = (QFontEngine *)CONCAT44(uStack_44,uStack_48);
      uStack_48 = 0;
      uStack_44 = 0;
      pQVar6[-1].m_fontEngine.d.ptr = pQVar7;
      pQStack_40 = (QStaticTextUserData *)0x0;
      pQVar6[-1].m_userData.d.ptr = pQVar9;
      ppQVar1 = &(this->super_QGenericArrayOps<QStaticTextItem>).
                 super_QArrayDataPointer<QStaticTextItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QStaticTextItem>).
                super_QArrayDataPointer<QStaticTextItem>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar8 = (this->super_QGenericArrayOps<QStaticTextItem>).
               super_QArrayDataPointer<QStaticTextItem>.ptr;
      pQVar6 = pQVar8 + i;
      __dest = pQVar6 + 1;
      local_b0.nInserts = 1;
      local_b0.bytes =
           ((this->super_QGenericArrayOps<QStaticTextItem>).super_QArrayDataPointer<QStaticTextItem>
            .size - i) * 0x50;
      local_b0.data = (QArrayDataPointer<QStaticTextItem> *)this;
      local_b0.displaceTo = __dest;
      memmove(__dest,pQVar8 + i,local_b0.bytes);
      pQVar6->field_0 = local_88;
      pQVar6->field_1 = aStack_80;
      pQVar6->numGlyphs = local_78;
      QFont::QFont(&pQVar8[i].font,this_00);
      pQVar9 = pQStack_40;
      pQVar8[i].field_0x38 = (undefined1)uStack_50;
      *(ulong *)&pQVar8[i].color = CONCAT44(uStack_5c,SStack_60);
      *(ulong *)((long)&pQVar8[i].color.ct + 4) = CONCAT44(local_54,uStack_58);
      pQVar7 = (QFontEngine *)CONCAT44(uStack_44,uStack_48);
      uStack_48 = 0;
      uStack_44 = 0;
      pQVar8[i].m_fontEngine.d.ptr = pQVar7;
      pQStack_40 = (QStaticTextUserData *)0x0;
      pQVar8[i].m_userData.d.ptr = pQVar9;
      local_b0.displaceFrom = __dest;
      Inserter::~Inserter(&local_b0);
    }
    if (pQStack_40 != (QStaticTextUserData *)0x0) {
      LOCK();
      plVar3 = (long *)((long)pQStack_40 + 8);
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if (((int)*plVar3 == 0) && (pQStack_40 != (QStaticTextUserData *)0x0)) {
        (**(code **)(*(long *)pQStack_40 + 8))();
      }
    }
    if (CONCAT44(uStack_44,uStack_48) != 0) {
      LOCK();
      piVar4 = (int *)(CONCAT44(uStack_44,uStack_48) + 0xc);
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if ((*piVar4 == 0) && ((long *)CONCAT44(uStack_44,uStack_48) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(uStack_44,uStack_48) + 8))();
      }
    }
    QFont::~QFont(this_00);
  }
  else {
    if (((this->super_QGenericArrayOps<QStaticTextItem>).super_QArrayDataPointer<QStaticTextItem>.
         size == i) &&
       (pQVar6 = (this->super_QGenericArrayOps<QStaticTextItem>).
                 super_QArrayDataPointer<QStaticTextItem>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pQVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x3333333333333333)) {
      pQVar8 = pQVar6 + i;
      pQVar8->numGlyphs = args->numGlyphs;
      aVar11 = args->field_1;
      pQVar8->field_0 = args->field_0;
      pQVar8->field_1 = aVar11;
      QFont::QFont(&pQVar8->font,&args->font);
      pQVar8->field_0x38 = args->field_0x38;
      uVar10 = *(undefined8 *)((long)&(args->color).ct + 4);
      *(undefined8 *)&pQVar8->color = *(undefined8 *)&args->color;
      *(undefined8 *)((long)&(pQVar8->color).ct + 4) = uVar10;
      pQVar7 = (args->m_fontEngine).d.ptr;
      (pQVar8->m_fontEngine).d.ptr = pQVar7;
      if (pQVar7 != (QFontEngine *)0x0) {
        LOCK();
        (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar9 = (args->m_userData).d.ptr;
      pQVar6[i].m_userData.d.ptr = pQVar9;
      if (pQVar9 != (QStaticTextUserData *)0x0) {
        LOCK();
        (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((i != 0) ||
         (pQVar6 = (this->super_QGenericArrayOps<QStaticTextItem>).
                   super_QArrayDataPointer<QStaticTextItem>.ptr,
         (QStaticTextItem *)
         ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar6))
      goto LAB_004b6c2c;
      pQVar6[-1].numGlyphs = args->numGlyphs;
      aVar11 = args->field_1;
      pQVar6[-1].field_0 = args->field_0;
      pQVar6[-1].field_1 = aVar11;
      QFont::QFont(&pQVar6[-1].font,&args->font);
      pQVar6[-1].field_0x38 = args->field_0x38;
      uVar10 = *(undefined8 *)((long)&(args->color).ct + 4);
      *(undefined8 *)&pQVar6[-1].color = *(undefined8 *)&args->color;
      *(undefined8 *)((long)&pQVar6[-1].color.ct + 4) = uVar10;
      pQVar7 = (args->m_fontEngine).d.ptr;
      pQVar6[-1].m_fontEngine.d.ptr = pQVar7;
      if (pQVar7 != (QFontEngine *)0x0) {
        LOCK();
        (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar9 = (args->m_userData).d.ptr;
      pQVar6[-1].m_userData.d.ptr = pQVar9;
      if (pQVar9 != (QStaticTextUserData *)0x0) {
        LOCK();
        (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QStaticTextItem>).
                 super_QArrayDataPointer<QStaticTextItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QStaticTextItem>).
              super_QArrayDataPointer<QStaticTextItem>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }